

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Body.h
# Opt level: O3

void __thiscall
RigidBodyDynamics::Body::Join(Body *this,SpatialTransform *transform,Body *other_body)

{
  double mass;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  RBDLError *this_00;
  long lVar7;
  undefined4 uVar8;
  uint uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  Matrix3d inertia_other_com_rotated_this_origin;
  Vector3d other_com;
  Matrix3d inertia_other;
  Matrix3d new_inertia;
  SpatialRigidBodyInertia this_rbi;
  Matrix3d inertia_summed;
  Matrix3d inertia_other_com_rotated;
  Matrix3d inertia_other_com;
  SpatialRigidBodyInertia other_rbi;
  undefined4 local_4f8;
  uint uStack_4f4;
  double dStack_4f0;
  string local_4b8;
  Matrix3d local_498;
  Vector3_t local_448;
  double local_428 [2];
  undefined4 local_418;
  uint uStack_414;
  undefined4 uStack_410;
  uint uStack_40c;
  double local_408;
  undefined8 uStack_400;
  undefined4 local_3f8;
  uint uStack_3f4;
  undefined4 uStack_3f0;
  uint uStack_3ec;
  double local_3e8;
  undefined8 local_3e0 [9];
  Matrix3_t local_398 [4];
  SpatialRigidBodyInertia local_278;
  undefined1 *local_228 [3];
  double local_210;
  double *local_208;
  undefined8 *local_1f8;
  undefined1 local_1e8 [16];
  double local_1d8;
  double dStack_1d0;
  undefined1 local_1c8 [16];
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  undefined8 local_1a0;
  double local_198;
  undefined4 local_190;
  uint uStack_18c;
  undefined4 uStack_188;
  uint uStack_184;
  undefined8 local_180;
  double local_178;
  undefined4 uStack_170;
  uint uStack_16c;
  undefined4 local_168;
  uint uStack_164;
  undefined8 local_160;
  Matrix3_t local_158;
  Matrix3_t local_110;
  undefined8 local_c8 [2];
  undefined4 local_b8;
  uint uStack_b4;
  undefined4 uStack_b0;
  uint uStack_ac;
  undefined8 local_a8;
  double local_a0;
  undefined4 local_98;
  uint uStack_94;
  double local_90;
  undefined8 local_88;
  SpatialRigidBodyInertia local_80;
  
  mass = other_body->mMass;
  if ((mass == 0.0) && (!NAN(mass))) {
    auVar13._8_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[5] != 0.0);
    auVar13._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[4] != 0.0);
    auVar14._8_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[7] != 0.0);
    auVar14._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[6] != 0.0);
    auVar14 = packssdw(auVar13,auVar14);
    lVar7 = -(ulong)((other_body->mInertia).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[3] != 0.0);
    auVar11._8_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[1] != 0.0);
    auVar11._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[0] != 0.0);
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ =
         -(ulong)((other_body->mInertia).super_Matrix3d.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                  array[2] != 0.0);
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar12 = packssdw(auVar11,auVar12);
    auVar12 = packssdw(auVar12,auVar14);
    if (((((((((((((((((auVar12 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar12 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar12 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar12 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar12 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar12 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar12 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar12 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar12 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar12 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar12 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar12 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar12 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar12 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar12 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar12[0xf])
       && ((dVar10 = (other_body->mInertia).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8], dVar10 == 0.0 && (!NAN(dVar10))))) {
      return;
    }
  }
  dVar10 = this->mMass + mass;
  if ((dVar10 == 0.0) && (!NAN(dVar10))) {
    this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,"Error: cannot join bodies as both have zero mass!\n","");
    Errors::RBDLError::RBDLError(this_00,&local_4b8);
    __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
  }
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[2] = (double)&transform->r;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[0] = (double)transform;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[1] = (double)&other_body->mCenterOfMass;
  Vector3_t::
  Vector3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            (&local_448,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)local_398);
  dVar1 = this->mMass;
  dVar4 = (this->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar5 = (this->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar2 = (this->mCenterOfMass).super_Vector3d.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_80,other_body->mMass,&other_body->mCenterOfMass,&other_body->mInertia);
  Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            (&local_278,this->mMass,&this->mCenterOfMass,&this->mInertia);
  Math::SpatialRigidBodyInertia::toMatrix(&local_80);
  lVar7 = 0;
  do {
    uVar6 = *(undefined8 *)
             ((long)local_398[0].super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar7 * 2 + 8);
    *(undefined8 *)((long)local_3e0 + lVar7) =
         *(undefined8 *)
          ((long)local_398[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar7 * 2);
    *(undefined8 *)((long)local_3e0 + lVar7 + 8) = uVar6;
    *(undefined8 *)((long)local_3e0 + lVar7 + 0x10) =
         *(undefined8 *)
          ((long)local_398[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar7 * 2 + 0x10);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  dVar15 = 1.0 / dVar10;
  dVar4 = dVar15 * (mass * local_448.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0] + dVar4 * dVar1);
  dVar5 = dVar15 * (mass * local_448.super_Vector3d.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[1] + dVar5 * dVar1);
  uVar8 = SUB84(dVar5,0);
  uVar9 = (uint)((ulong)dVar5 >> 0x20);
  auVar3._8_4_ = uVar8;
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = uVar9;
  local_a0 = (other_body->mCenterOfMass).super_Vector3d.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  lVar7 = 0;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[4] = (double)local_c8;
  local_c8[0] = 0;
  local_a8 = 0;
  local_90 = -local_a0;
  local_b8 = *(undefined4 *)
              ((other_body->mCenterOfMass).super_Vector3d.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
              1);
  uStack_94 = *(uint *)((long)(other_body->mCenterOfMass).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0xc);
  uStack_b0 = *(undefined4 *)
               ((other_body->mCenterOfMass).super_Vector3d.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2);
  uStack_b4 = uStack_94 ^ 0x80000000;
  uStack_ac = *(uint *)((long)(other_body->mCenterOfMass).super_Vector3d.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data.array + 0x14) ^ 0x80000000;
  local_88 = 0;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[0] = (double)local_3e0;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[3] = mass;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[6] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_98 = local_b8;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            (&local_110,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)local_398);
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[0] = (double)transform;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[1] = (double)&local_110;
  local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
  .m_data.array[2] = (double)transform;
  Matrix3_t::
  Matrix3_t<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            (&local_158,
             (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)local_398);
  Math::parallel_axis(&local_498,&local_158,mass,&local_448);
  Math::SpatialRigidBodyInertia::toMatrix(&local_278);
  do {
    uVar6 = *(undefined8 *)
             ((long)local_398[0].super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array + lVar7 * 2 + 8);
    *(undefined8 *)((long)local_428 + lVar7) =
         *(undefined8 *)
          ((long)local_398[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar7 * 2);
    *(undefined8 *)((long)local_428 + lVar7 + 8) = uVar6;
    *(undefined8 *)((long)&local_418 + lVar7) =
         *(undefined8 *)
          ((long)local_398[0].super_Matrix3d.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
          + lVar7 * 2 + 0x10);
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  dVar15 = dVar15 * (local_448.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2] * mass + dVar1 * dVar2);
  local_208 = local_428;
  local_228[0] = local_1e8;
  local_1e8._8_4_ =
       SUB84(local_428[1] +
             local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1],0);
  local_1e8._0_8_ =
       local_428[0] +
       local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  local_1e8._12_4_ =
       (int)((ulong)(local_428[1] +
                    local_498.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[1]) >> 0x20);
  local_1d8 = (double)CONCAT44(uStack_414,local_418) +
              local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[2];
  dStack_1d0 = (double)CONCAT44(uStack_40c,uStack_410) +
               local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
               .m_storage.m_data.array[3];
  local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] =
       (double)CONCAT44(uStack_400._4_4_,(undefined4)uStack_400) +
       local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  local_1c8._8_4_ =
       SUB84(local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[5],0);
  local_1c8._0_8_ =
       local_408 +
       local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  local_1c8._12_4_ =
       (int)((ulong)local_498.super_Matrix3d.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                    array[5] >> 0x20);
  local_1b8 = (double)CONCAT44(uStack_3f4,local_3f8) +
              local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[6];
  dStack_1b0 = (double)CONCAT44(uStack_3ec,uStack_3f0) +
               local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
               .m_storage.m_data.array[7];
  local_1a8 = local_3e8 +
              local_498.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array[8];
  local_4f8 = SUB84(dVar4,0);
  uStack_4f4 = (uint)((ulong)dVar4 >> 0x20);
  uStack_3ec = uStack_4f4 ^ 0x80000000;
  local_428[0] = 0.0;
  local_408 = 0.0;
  uStack_3f0 = local_4f8;
  uStack_414 = uVar9 ^ 0x80000000;
  uStack_40c = (uint)((ulong)dVar15 >> 0x20) ^ 0x80000000;
  uStack_410 = SUB84(dVar15,0);
  local_3e8 = 0.0;
  local_1f8 = &local_1a0;
  local_1a0 = 0;
  local_180 = 0;
  local_168 = local_4f8;
  local_160 = 0;
  local_428[1] = dVar15;
  local_418 = uVar8;
  local_3f8 = uVar8;
  uStack_3f4 = uVar9;
  local_210 = dVar10;
  local_198 = dVar15;
  local_190 = uVar8;
  uStack_18c = uStack_414;
  uStack_188 = uStack_410;
  uStack_184 = uStack_40c;
  uStack_170 = uVar8;
  uStack_16c = uVar9;
  uStack_164 = uStack_3ec;
  uStack_400 = dVar4;
  local_178 = dVar4;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const>>
            (local_398,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>_>_>
              *)local_228);
  this->mMass = dVar10;
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[0] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[1] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[2] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[3] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[3];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[4] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[5] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[6] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[6];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[7] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[7];
  (this->mInertia).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
  m_storage.m_data.array[8] =
       local_398[0].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  dStack_4f0 = auVar3._8_8_;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[0] = dVar4;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[1] = dStack_4f0;
  (this->mCenterOfMass).super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
  m_storage.m_data.array[2] = dVar15;
  this->mIsVirtual = false;
  return;
}

Assistant:

void Join (const Math::SpatialTransform &transform, const Body &other_body)
  {
#ifndef RBDL_USE_CASADI_MATH
    // nothing to do if we join a massles body to the current.
    if (other_body.mMass == 0. && other_body.mInertia == Math::Matrix3d::Zero()) {
      return;
    }
#endif

    Math::Scalar other_mass = other_body.mMass;
    Math::Scalar new_mass = mMass + other_mass;

#ifndef RBDL_USE_CASADI_MATH
    if (new_mass == 0.) {
      throw Errors::RBDLError("Error: cannot join bodies as both have zero mass!\n");
    }
#endif

    Math::Vector3d other_com = transform.E.transpose() * other_body.mCenterOfMass +
                               transform.r;
    Math::Vector3d new_com = (1 / new_mass ) * (mMass * mCenterOfMass + other_mass *
                             other_com);

    LOG << "other_com = " << std::endl << other_com.transpose() << std::endl;
    LOG << "rotation = " << std::endl << transform.E << std::endl;

    // We have to transform the inertia of other_body to the new COM. This
    // is done in 4 steps:
    //
    // 1. Transform the inertia from other origin to other COM
    // 2. Rotate the inertia that it is aligned to the frame of this body
    // 3. Transform inertia of other_body to the origin of the frame of
    // this body
    // 4. Sum the two inertias
    // 5. Transform the summed inertia to the new COM

    Math::SpatialRigidBodyInertia other_rbi =
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC (other_body.mMass,
          other_body.mCenterOfMass, other_body.mInertia);
    Math::SpatialRigidBodyInertia this_rbi =
      Math::SpatialRigidBodyInertia::createFromMassComInertiaC (mMass, mCenterOfMass,
          mInertia);

    Math::Matrix3d inertia_other = other_rbi.toMatrix().block<3,3>(0,0);
    LOG << "inertia_other = " << std::endl << inertia_other << std::endl;

    // 1. Transform the inertia from other origin to other COM
    Math::Matrix3d other_com_cross = Math::VectorCrossMatrix(
                                       other_body.mCenterOfMass);
    Math::Matrix3d inertia_other_com = inertia_other - other_mass * other_com_cross
                                       * other_com_cross.transpose();
    LOG << "inertia_other_com = " << std::endl << inertia_other_com << std::endl;

    // 2. Rotate the inertia that it is aligned to the frame of this body
    Math::Matrix3d inertia_other_com_rotated = transform.E.transpose() *
        inertia_other_com * transform.E;
    LOG << "inertia_other_com_rotated = " << std::endl << inertia_other_com_rotated
        << std::endl;

    // 3. Transform inertia of other_body to the origin of the frame of this body
    Math::Matrix3d inertia_other_com_rotated_this_origin = Math::parallel_axis (
          inertia_other_com_rotated, other_mass, other_com);
    LOG << "inertia_other_com_rotated_this_origin = " << std::endl <<
        inertia_other_com_rotated_this_origin << std::endl;

    // 4. Sum the two inertias
    Math::Matrix3d inertia_summed = Math::Matrix3d (this_rbi.toMatrix().block<3,3>
                                    (0,0)) + inertia_other_com_rotated_this_origin;
    LOG << "inertia_summed  = " << std::endl << inertia_summed << std::endl;

    // 5. Transform the summed inertia to the new COM
    Math::Matrix3d new_inertia = inertia_summed - new_mass *
                                 Math::VectorCrossMatrix (new_com) * Math::VectorCrossMatrix(
                                   new_com).transpose();

    LOG << "new_mass = " << new_mass << std::endl;
    LOG << "new_com  = " << new_com.transpose() << std::endl;
    LOG << "new_inertia  = " << std::endl << new_inertia << std::endl;

    *this = Body (new_mass, new_com, new_inertia);
  }